

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_is_blocked(quicly_conn_t *conn)

{
  quicly_conn_t *conn_local;
  int local_4;
  
  if ((conn->egress).max_data.sent < (conn->egress).max_data.permitted) {
    local_4 = 0;
  }
  else {
    if ((conn->egress).data_blocked == QUICLY_SENDER_STATE_NONE) {
      (conn->egress).data_blocked = QUICLY_SENDER_STATE_SEND;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int quicly_is_blocked(quicly_conn_t *conn)
{
    if (conn->egress.max_data.sent < conn->egress.max_data.permitted)
        return 0;

    /* schedule the transmission of DATA_BLOCKED frame, if it's new information */
    if (conn->egress.data_blocked == QUICLY_SENDER_STATE_NONE)
        conn->egress.data_blocked = QUICLY_SENDER_STATE_SEND;

    return 1;
}